

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.h
# Opt level: O1

string * __thiscall
cmGlobalNinjaMultiGenerator::ConfigDirectory
          (string *__return_storage_ptr__,cmGlobalNinjaMultiGenerator *this,string *config)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  char local_28 [32];
  
  local_48 = config->_M_string_length;
  if (local_48 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_58._M_str = local_28;
    local_38 = 1;
    local_28[0] = '/';
    local_40 = (config->_M_dataplus)._M_p;
    local_58._M_len = 1;
    views._M_len = 2;
    views._M_array = &local_58;
    local_30 = local_58._M_str;
    cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConfigDirectory(const std::string& config) const override
  {
    if (!config.empty()) {
      return cmStrCat('/', config);
    }
    return "";
  }